

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O2

void __thiscall AllRgbWidget::SetTargetImage(AllRgbWidget *this,QImage *targetImage)

{
  QImage *this_00;
  char cVar1;
  QImage aQStack_48 [24];
  QImage local_30 [24];
  
  this_00 = &this->target_;
  cVar1 = QImage::operator!=(targetImage,(QImage *)this_00);
  if (cVar1 != '\0') {
    QImage::operator=(this_00,(QImage *)targetImage);
    QImage::scaled(local_30,(int)this_00,100,100,FastTransformation);
    QImage::operator=(&this->targetThumbnail_,local_30);
    QImage::~QImage(local_30);
    QImage::QImage(aQStack_48,(QImage *)this_00);
    onTargetUpdated(this,aQStack_48);
    QImage::~QImage(aQStack_48);
    QWidget::update();
  }
  return;
}

Assistant:

void AllRgbWidget::SetTargetImage(const QImage& targetImage)
{
    if (targetImage != target_) {
        target_ = targetImage;
        targetThumbnail_ = target_.scaled(100, 100);
        emit onTargetUpdated(target_);
        update();
    }
}